

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::test_true(void)

{
  bool bVar1;
  value vVar2;
  int local_174;
  view_type local_170;
  char input [5];
  reader reader;
  
  builtin_strncpy(input,"true",5);
  local_170._M_len = strlen(input);
  local_170._M_str = input;
  trial::protocol::json::basic_reader<char>::basic_reader(&reader,&local_170);
  local_174 = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x49,"void basic_suite::test_true()",&local_170,&local_174);
  local_170._M_len._0_4_ =
       trial::protocol::json::token::symbol::convert(reader.decoder.current.code);
  local_174 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x4a,"void basic_suite::test_true()",&local_170,&local_174);
  vVar2 = trial::protocol::json::basic_reader<char>::category(&reader);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,vVar2);
  local_174 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x4b,"void basic_suite::test_true()",&local_170,&local_174);
  bVar1 = trial::protocol::json::basic_reader<char>::overloader<bool,_void>::value(&reader);
  local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
  local_174._0_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x4c,"void basic_suite::test_true()",&local_170,&local_174);
  local_170._M_len = (long)reader.decoder.current.view.tail - (long)reader.decoder.current.view.head
  ;
  local_170._M_str = reader.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[5]>
            ("reader.literal()","\"true\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x4d,"void basic_suite::test_true()",&local_170,"true");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&reader);
  local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
  local_174 = (uint)local_174._1_3_ << 8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x4e,"void basic_suite::test_true()",&local_170,&local_174);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.stack);
  return;
}

Assistant:

void test_true()
{
    const char input[] = "true";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "true");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}